

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

void ncnn::qsort_descent_inplace<ncnn::Rect>
               (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  pointer pRVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  int right_00;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  pointer pfVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  
  pfVar15 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    fVar3 = pfVar15[(left + right) / 2];
    iVar14 = left;
    right_00 = right;
    while (iVar14 <= right_00) {
      lVar16 = (long)iVar14 + -1;
      lVar20 = (long)iVar14 << 4;
      do {
        iVar11 = iVar14;
        lVar13 = lVar20;
        iVar12 = iVar11 + 1;
        lVar10 = lVar16 + 1;
        lVar16 = lVar16 + 1;
        lVar20 = lVar13 + 0x10;
        iVar14 = iVar12;
      } while (fVar3 < pfVar15[lVar10]);
      lVar20 = (long)right_00 + 1;
      lVar10 = (long)right_00 << 4;
      do {
        iVar17 = right_00;
        lVar19 = lVar10;
        iVar18 = iVar17 + -1;
        lVar9 = lVar20 + -1;
        lVar20 = lVar20 + -1;
        lVar10 = lVar19 + -0x10;
        right_00 = iVar18;
      } while (pfVar15[lVar9] <= fVar3 && fVar3 != pfVar15[lVar9]);
      iVar14 = iVar11;
      right_00 = iVar17;
      if (lVar16 <= lVar20) {
        pRVar5 = (datas->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&pRVar5->x1 + lVar13);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pRVar5->x1 + lVar19);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pRVar5->x1 + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)&pRVar5->x1 + lVar19);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        pfVar15 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar4 = pfVar15[lVar16];
        pfVar15[lVar16] = pfVar15[lVar20];
        pfVar15[lVar20] = fVar4;
        iVar14 = iVar12;
        right_00 = iVar18;
      }
    }
    if (left < right_00) {
      qsort_descent_inplace<ncnn::Rect>(datas,scores,left,right_00);
      pfVar15 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    left = iVar14;
  } while (iVar14 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}